

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O2

bool __thiscall
Am_Gesture_Trainer::Add_Example
          (Am_Gesture_Trainer *this,Am_String *classname,Am_Feature_Vector *fv,bool unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Gesture_Trainer_Data *this_00;
  Gesture_Class *pGVar2;
  Am_Wrapper *value;
  Am_String local_30;
  
  this_00 = this->data;
  if (this_00 == (Am_Gesture_Trainer_Data *)0x0) {
    this_00 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(this_00);
  }
  else {
    if (!unique) goto LAB_001b18af;
    iVar1 = (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (this_00);
    this_00 = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar1);
  }
  this->data = this_00;
LAB_001b18af:
  Am_String::Am_String(&local_30,classname);
  pGVar2 = Am_Gesture_Trainer_Data::Find_Class(this_00,&local_30);
  Am_String::~Am_String(&local_30);
  if (pGVar2 != (Gesture_Class *)0x0) {
    value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(fv);
    Am_Value_List::Add(&pGVar2->examples,value,Am_TAIL,true);
    Am_Gesture_Classifier::operator=
              (&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
  }
  return pGVar2 != (Gesture_Class *)0x0;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Example(Am_String classname, Am_Feature_Vector fv,
                                bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  Am_Gesture_Trainer_Data::Gesture_Class *c = data->Find_Class(classname);
  if (!c)
    return false;

  c->examples.Add(fv);

  data->cached_classifier = nullptr;
  return true;
}